

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

void __thiscall color<unsigned_char,_3U>::normalize(color<unsigned_char,_3U> *this)

{
  vec3<unsigned_char> local_20;
  
  local_20.super_vec3_base.b = (float)(this->field_0).comps[2];
  local_20.super_vec3_base.r = (float)(*(ushort *)&this->field_0 & 0xff);
  local_20.super_vec3_base.g = (float)(byte)(*(ushort *)&this->field_0 >> 8);
  vec3<unsigned_char>::normalize(&local_20);
  (this->field_0).comps[0] = (uchar)(int)local_20.super_vec3_base.r;
  (this->field_0).comps[1] = (uchar)(int)local_20.super_vec3_base.g;
  (this->field_0).comps[2] = (uchar)(int)local_20.super_vec3_base.b;
  return;
}

Assistant:

void normalize() {
        vec3<componentType> v((float)r, (float)g, (float)b);
        v.normalize();
        r = (componentType)v.r;
        g = (componentType)v.g;
        b = (componentType)v.b;
    }